

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

GLdouble gl4cts::CopyImage::Utils::getEpsilon(GLenum internal_format)

{
  TestError *this;
  GLdouble GVar1;
  
  GVar1 = 0.0;
  if ((int)internal_format < 0x8814) {
    if (0x13 < internal_format - 0x8229) {
      if (internal_format - 0x804f < 0xd) {
        if ((0x17efU >> (internal_format - 0x804f & 0x1f) & 1) == 0) {
          GVar1 = 0.00390625;
        }
      }
      else if (internal_format != 0x2a10) goto LAB_0087aa5d;
    }
  }
  else if ((int)internal_format < 0x8d70) {
    if (((7 < internal_format - 0x8814) || ((0xc3U >> (internal_format - 0x8814 & 0x1f) & 1) == 0))
       && ((internal_format != 0x8c3a && (internal_format != 0x8c3d)))) {
LAB_0087aa5d:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x2d9);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if ((((0x1f < internal_format - 0x8d70) ||
            ((0xc30c30c3U >> (internal_format - 0x8d70 & 0x1f) & 1) == 0)) &&
           (7 < internal_format - 0x8f94)) && (internal_format != 0x906f)) goto LAB_0087aa5d;
  return GVar1;
}

Assistant:

GLdouble Utils::getEpsilon(GLenum internal_format)
{
	GLdouble epsilon;

	switch (internal_format)
	{
	case GL_R8:
	case GL_R8_SNORM:
	case GL_R16:
	case GL_R16F:
	case GL_R16_SNORM:
	case GL_R32F:
	case GL_R8I:
	case GL_R8UI:
	case GL_R16I:
	case GL_R16UI:
	case GL_R32I:
	case GL_R32UI:
	case GL_RG8:
	case GL_RG8_SNORM:
	case GL_RG16:
	case GL_RG16F:
	case GL_RG16_SNORM:
	case GL_RG32F:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG32I:
	case GL_RG32UI:
	case GL_R3_G3_B2:
	case GL_RGB4:
	case GL_RGB5:
	case GL_RGB8:
	case GL_RGB8_SNORM:
	case GL_R11F_G11F_B10F:
	case GL_RGB16:
	case GL_RGB16F:
	case GL_RGB16_SNORM:
	case GL_RGB32F:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_RGB10:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB32I:
	case GL_RGB32UI:
	case GL_RGB9_E5:
	case GL_RGBA2:
	case GL_RGBA4:
	case GL_RGB5_A1:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_RGB10_A2:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16_SNORM:
	case GL_RGBA32F:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGB10_A2UI:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA32I:
	case GL_RGBA32UI:
		epsilon = 0.0;
		break;
	case GL_RGB12:
	case GL_RGBA12:
		epsilon = 0.00390625;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return epsilon;
}